

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O3

void __thiscall MeCab::FreeList<mecab_node_t>::~FreeList(FreeList<mecab_node_t> *this)

{
  pointer ppmVar1;
  ulong uVar2;
  pointer ppmVar3;
  
  this->_vptr_FreeList = (_func_int **)&PTR__FreeList_00140958;
  this->li_ = 0;
  ppmVar3 = (this->freeList).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppmVar1 = (this->freeList).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppmVar1 != ppmVar3) {
    uVar2 = 0;
    do {
      if (ppmVar3[uVar2] != (mecab_node_t *)0x0) {
        operator_delete__(ppmVar3[uVar2]);
        uVar2 = this->li_;
        ppmVar3 = (this->freeList).
                  super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppmVar1 = (this->freeList).
                  super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar2 = uVar2 + 1;
      this->li_ = uVar2;
    } while (uVar2 < (ulong)((long)ppmVar1 - (long)ppmVar3 >> 3));
  }
  if (ppmVar3 != (pointer)0x0) {
    operator_delete(ppmVar3);
    return;
  }
  return;
}

Assistant:

virtual ~FreeList() {
    for (li_ = 0; li_ < freeList.size(); li_++)
      delete [] freeList[li_];
  }